

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

bool server::setmaster(clientinfo *ci,bool val,char *pass,char *authname,char *authdesc,int authpriv
                      ,bool force,bool trial)

{
  long lVar1;
  clientinfo *pcVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  ENetPacket *packet;
  ulong uVar7;
  char *fmt;
  int iVar8;
  char *pcVar9;
  int i;
  long lVar10;
  packetbuf p;
  string msg;
  
  if (authname != (char *)0x0 && !val) {
    return false;
  }
  if (val) {
    if ((*adminpass != '\0') && (bVar3 = checkpassword(ci,adminpass,pass), bVar3)) {
      authpriv = 3;
    }
    if (ci->local != false) {
      authpriv = 3;
    }
    if (authpriv <= ci->privilege) {
      return true;
    }
    if (authpriv < 2 && !force) {
      if ((ci->state).state == 5) {
        iVar8 = ci->clientnum;
        pcVar9 = "Spectators may not claim master.";
LAB_00136562:
        sendf(iVar8,1,"ris",0x23,pcVar9);
        return false;
      }
      if (enablemultiplemasters == 0) {
        uVar7 = 0;
        uVar4 = (ulong)DAT_00191854;
        if ((int)DAT_00191854 < 1) {
          uVar4 = uVar7;
        }
        for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
          pcVar2 = *(clientinfo **)(clients + uVar7 * 8);
          if ((pcVar2 != ci) && (pcVar2->privilege != 0)) {
            iVar8 = ci->clientnum;
            pcVar9 = "\f3Error: Someone already has privileges";
            goto LAB_00136562;
          }
        }
      }
      if ((authname == (char *)0x0) &&
         (((mastermask & 0x1000) == 0 && ci->privilege == 0) && ci->local == false)) {
        iVar8 = ci->clientnum;
        pcVar9 = "This server requires you to use the \"/auth\" command to claim master.";
        goto LAB_00136562;
      }
    }
    if (trial) {
      return true;
    }
    ci->privilege = authpriv;
    if (authpriv - 1U < 3) {
      pcVar9 = (&PTR_anon_var_dwarf_2dab7_0017f690)[authpriv - 1U];
    }
    else {
      pcVar9 = "\f1unknown";
    }
  }
  else {
    iVar8 = ci->privilege;
    if (iVar8 == 0 || trial) {
      return iVar8 != 0;
    }
    if (iVar8 - 1U < 3) {
      pcVar9 = (&PTR_anon_var_dwarf_2dab7_0017f690)[iVar8 - 1U];
    }
    else {
      pcVar9 = "\f1unknown";
    }
    revokemaster(ci);
  }
  uVar7 = 0;
  uVar4 = (ulong)DAT_00191854;
  if ((int)DAT_00191854 < 1) {
    uVar4 = uVar7;
  }
  bVar3 = false;
  for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    lVar10 = *(long *)(clients + uVar7 * 8);
    if ((*(char *)(lVar10 + 0x339) != '\0') || (0 < *(int *)(lVar10 + 0x334))) {
      bVar3 = true;
    }
  }
  if (!bVar3) {
    mastermode = 0;
    allowedips._12_4_ = 0;
  }
  if (val && authname != (char *)0x0) {
    if ((authdesc != (char *)0x0) && (*authdesc != '\0')) {
      p.super_ucharbuf.buf = (uchar *)msg;
      pcVar5 = colorname(ci);
      stringformatter::operator()
                ((stringformatter *)&p,"\f0%s \f7claimed \f6%s \f7as \'\fs\f5%s\fr\' [\fs\f0%s\fr]",
                 pcVar5,pcVar9,authname,authdesc);
      goto LAB_001366c4;
    }
    p.super_ucharbuf.buf = (uchar *)msg;
    pcVar6 = colorname(ci);
    fmt = "\f0%s \f7claimed %s \f7as \'\fs\f5%s\fr\'";
    pcVar5 = pcVar9;
    pcVar9 = authname;
  }
  else {
    p.super_ucharbuf.buf = (uchar *)msg;
    pcVar6 = colorname(ci);
    pcVar5 = "relinquished";
    if (val) {
      pcVar5 = "claimed";
    }
    fmt = "\f0%s \f7%s %s";
  }
  stringformatter::operator()((stringformatter *)&p,fmt,pcVar6,pcVar5,pcVar9);
LAB_001366c4:
  packetbuf::packetbuf(&p,5000,1);
  putint(&p,0x23);
  sendstring(msg,&p);
  putint(&p,0x3d);
  putint(&p,mastermode);
  for (lVar10 = 0; lVar10 < (int)DAT_00191854; lVar10 = lVar10 + 1) {
    lVar1 = *(long *)(clients + lVar10 * 8);
    if (0 < *(int *)(lVar1 + 0x334)) {
      putint(&p,*(int *)(lVar1 + 8));
      putint(&p,*(int *)(*(long *)(clients + lVar10 * 8) + 0x334));
    }
  }
  putint(&p,-1);
  packet = packetbuf::finalize(&p);
  sendpacket(-1,1,packet,-1);
  checkpausegame();
  packetbuf::~packetbuf(&p);
  return true;
}

Assistant:

bool setmaster(clientinfo *ci, bool val, const char *pass = "", const char *authname = NULL, const char *authdesc = NULL, int authpriv = PRIV_MASTER, bool force = false, bool trial = false)
    {
        if(authname && !val) return false;
        const char *name = "";
        if(val)
        {
            bool haspass = adminpass[0] && checkpassword(ci, adminpass, pass);
            int wantpriv = ci->local || haspass ? PRIV_ADMIN : authpriv;
            if(wantpriv <= ci->privilege) return true;
            else if(wantpriv <= PRIV_MASTER && !force)
            {
                if(ci->state.state==CS_SPECTATOR)
                {
                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "Spectators may not claim master.");
                    return false;
                }
                if(!enablemultiplemasters) {
                    loopv(clients) if(ci!=clients[i] && clients[i]->privilege)
                    {
                        sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3Error: Someone already has privileges");
                        return false;
                    }
                }
                if(!authname && !(mastermask&MM_AUTOAPPROVE) && !ci->privilege && !ci->local)
                {
                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "This server requires you to use the \"/auth\" command to claim master.");
                    return false;
                }
            }
            if(trial) return true;
            ci->privilege = wantpriv;
            name = privname(ci->privilege);
        }
        else
        {
            if(!ci->privilege) return false;
            if(trial) return true;
            name = privname(ci->privilege);
            revokemaster(ci);
        }
        bool hasmaster = false;
        loopv(clients) if(clients[i]->local || clients[i]->privilege >= PRIV_MASTER) hasmaster = true;
        if(!hasmaster)
        {
            mastermode = MM_OPEN;
            allowedips.shrink(0);
        }
        string msg;
        if(val && authname)
        {
            if(authdesc && authdesc[0]) formatstring(msg)("\f0%s \f7claimed \f6%s \f7as '\fs\f5%s\fr' [\fs\f0%s\fr]", colorname(ci), name, authname, authdesc);
            else formatstring(msg)("\f0%s \f7claimed %s \f7as '\fs\f5%s\fr'", colorname(ci), name, authname);
        }
        else formatstring(msg)("\f0%s \f7%s %s", colorname(ci), val ? "claimed" : "relinquished", name);
        packetbuf p(MAXTRANS, ENET_PACKET_FLAG_RELIABLE);
        putint(p, N_SERVMSG);
        sendstring(msg, p);
        putint(p, N_CURRENTMASTER);
        putint(p, mastermode);
        loopv(clients) if(clients[i]->privilege >= PRIV_MASTER)
        {
            putint(p, clients[i]->clientnum);
            putint(p, clients[i]->privilege);
        }
        putint(p, -1);
        sendpacket(-1, 1, p.finalize());
        checkpausegame();
        return true;
    }